

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar.cpp
# Opt level: O0

void test256x256(void)

{
  rep rVar1;
  ostream *poVar2;
  HaarWavelet *this;
  nanoseconds ns1;
  Mat dst1;
  HaarWavelet w2;
  nanoseconds ns;
  time_point end;
  time_point start;
  HaarWavelet wavelet;
  Mat dst;
  Mat m;
  Mat *in_stack_fffffffffffffd30;
  HaarWavelet *in_stack_fffffffffffffd38;
  _InputArray *in_stack_fffffffffffffd40;
  double in_stack_fffffffffffffd48;
  HaarWavelet *in_stack_fffffffffffffd50;
  duration<long,_std::ratio<1L,_1000000000L>_> local_268;
  undefined8 local_260;
  Mat local_258 [96];
  undefined8 local_1f8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1e0;
  undefined8 local_1d8;
  Mat local_1d0 [96];
  undefined8 local_170;
  _InputArray local_138 [2];
  _InputArray local_100;
  _InputOutputArray local_d8;
  Mat local_c0 [96];
  Mat local_60 [96];
  
  cv::Mat::Mat(local_60,0x100,0x100,0x10);
  cv::Mat::Mat(local_c0);
  cv::_InputOutputArray::_InputOutputArray
            ((_InputOutputArray *)in_stack_fffffffffffffd40,(Mat *)in_stack_fffffffffffffd38);
  cv::Scalar_<double>::Scalar_
            ((Scalar_<double> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (double)in_stack_fffffffffffffd40,(double)in_stack_fffffffffffffd38,
             (double)in_stack_fffffffffffffd30);
  cv::_InputArray::_InputArray<double,4,1>
            (in_stack_fffffffffffffd40,(Matx<double,_4,_1> *)in_stack_fffffffffffffd38);
  cv::Scalar_<double>::Scalar_
            ((Scalar_<double> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (double)in_stack_fffffffffffffd40,(double)in_stack_fffffffffffffd38,
             (double)in_stack_fffffffffffffd30);
  cv::_InputArray::_InputArray<double,4,1>
            (in_stack_fffffffffffffd40,(Matx<double,_4,_1> *)in_stack_fffffffffffffd38);
  cv::randu(&local_d8,&local_100,local_138);
  cv::_InputArray::~_InputArray(local_138);
  cv::_InputArray::~_InputArray(&local_100);
  cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x10461c);
  imagestego::HaarWavelet::HaarWavelet((HaarWavelet *)in_stack_fffffffffffffd50);
  local_170 = std::chrono::_V2::system_clock::now();
  imagestego::HaarWavelet::transform
            ((HaarWavelet *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  cv::Mat::operator=(local_c0,local_1d0);
  cv::Mat::~Mat(local_1d0);
  local_1d8 = std::chrono::_V2::system_clock::now();
  local_1e0.__r =
       (rep)std::chrono::operator-
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffffd38,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffffd30);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_1e0);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar1);
  poVar2 = std::operator<<(poVar2," ns");
  std::operator<<(poVar2,'\n');
  imagestego::experimental::HaarWavelet::HaarWavelet(in_stack_fffffffffffffd50);
  local_1f8 = std::chrono::_V2::system_clock::now();
  local_170 = local_1f8;
  imagestego::experimental::HaarWavelet::transform
            (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  local_260 = std::chrono::_V2::system_clock::now();
  local_1d8 = local_260;
  local_268.__r =
       (rep)std::chrono::operator-
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffffd38,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffffd30);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_268);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar1);
  poVar2 = std::operator<<(poVar2," ns");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"Total speedup is: ");
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_1e0);
  this = (HaarWavelet *)(double)rVar1;
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_268);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)this / (double)rVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  cv::Mat::~Mat(local_258);
  imagestego::experimental::HaarWavelet::~HaarWavelet(this);
  imagestego::HaarWavelet::~HaarWavelet((HaarWavelet *)this);
  cv::Mat::~Mat(local_c0);
  cv::Mat::~Mat(local_60);
  return;
}

Assistant:

void test256x256() {
    cv::Mat m(256, 256, CV_8UC3), dst;
    cv::randu(m, cv::Scalar(0, 0, 0), cv::Scalar(255, 255, 255));
    imagestego::HaarWavelet wavelet;
    // start
    auto start = chrono::high_resolution_clock::now();
    dst = wavelet.transform(m);
    auto end = chrono::high_resolution_clock::now();
    // end
    chrono::nanoseconds ns = end - start;
    std::cout << ns.count() << " ns" << '\n';

    imagestego::experimental::HaarWavelet w2;

    start = chrono::high_resolution_clock::now();
    cv::Mat dst1 = w2.transform(m);
    end = chrono::high_resolution_clock::now();
    chrono::nanoseconds ns1 = end - start;
    std::cout << ns1.count() << " ns" << '\n';

    std::cout << "Total speedup is: " << double(ns.count()) / ns1.count() << std::endl;
}